

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void iadst16_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  undefined1 auVar5 [16];
  __m128i alVar6;
  __m128i t0;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  __m128i alVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i alVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  __m128i alVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i alVar36;
  undefined1 auVar37 [16];
  __m128i alVar38;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i t1;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  longlong local_38;
  longlong lStack_30;
  undefined1 auVar8 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  
  auVar2 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar1 = auVar2._0_4_;
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0xffff8028),ZEXT416(0xffff8028),0);
  auVar3._0_4_ = auVar2._0_4_;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  alVar4 = (__m128i)pmulhrsw(auVar45,(undefined1  [16])*input);
  auVar3 = pmulhrsw(auVar3,(undefined1  [16])*input);
  *output = alVar4;
  auVar8._0_12_ = alVar4._0_12_;
  auVar8._12_2_ = alVar4[0]._6_2_;
  auVar8._14_2_ = auVar3._6_2_;
  auVar7._12_4_ = auVar8._12_4_;
  auVar7._0_10_ = alVar4._0_10_;
  auVar7._10_2_ = auVar3._4_2_;
  auVar58._10_6_ = auVar7._10_6_;
  auVar58._0_8_ = alVar4[0];
  auVar58._8_2_ = alVar4[0]._4_2_;
  auVar64._8_8_ = auVar58._8_8_;
  auVar64._6_2_ = auVar3._2_2_;
  auVar64._4_2_ = alVar4[0]._2_2_;
  auVar64._0_2_ = (undefined2)alVar4[0];
  auVar64._2_2_ = auVar3._0_2_;
  auVar49._2_2_ = auVar3._8_2_;
  auVar49._0_2_ = (short)alVar4[1];
  auVar49._4_2_ = alVar4[1]._2_2_;
  auVar49._6_2_ = auVar3._10_2_;
  auVar49._8_2_ = alVar4[1]._4_2_;
  auVar49._10_2_ = auVar3._12_2_;
  auVar49._12_2_ = alVar4[1]._6_2_;
  auVar49._14_2_ = auVar3._14_2_;
  auVar2._8_4_ = 0x31f0fb1;
  auVar2._0_8_ = 0x31f0fb1031f0fb1;
  auVar2._12_4_ = 0x31f0fb1;
  auVar22 = pmaddwd(auVar64,auVar2);
  auVar2 = pmaddwd(auVar2,auVar49);
  auVar11._8_4_ = 0xf04f031f;
  auVar11._0_8_ = 0xf04f031ff04f031f;
  auVar11._12_4_ = 0xf04f031f;
  auVar5 = pmaddwd(auVar64,auVar11);
  auVar12 = pmaddwd(auVar11,auVar49);
  auVar23._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar22._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar24 = packssdw(auVar23,auVar22);
  auVar50._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar13._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  alVar6 = (__m128i)packssdw(auVar50,auVar13);
  auVar33._8_4_ = 0x61f0ec8;
  auVar33._0_8_ = 0x61f0ec8061f0ec8;
  auVar33._12_4_ = 0x61f0ec8;
  auVar5 = pmaddwd(auVar64,auVar33);
  auVar2 = pmaddwd(auVar49,auVar33);
  auVar44._8_4_ = 0xf138061f;
  auVar44._0_8_ = 0xf138061ff138061f;
  auVar44._12_4_ = 0xf138061f;
  auVar22 = pmaddwd(auVar64,auVar44);
  auVar12 = pmaddwd(auVar49,auVar44);
  auVar57._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar57._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar57._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar57._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar5._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar5._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar5._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar5._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar58 = packssdw(auVar57,auVar5);
  auVar14._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar16._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  alVar15 = (__m128i)packssdw(auVar14,auVar16);
  auVar2 = psubsw((undefined1  [16])0x0,auVar24);
  auVar20._0_12_ = auVar24._0_12_;
  auVar20._12_2_ = auVar24._6_2_;
  auVar20._14_2_ = alVar6[0]._6_2_;
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._0_10_ = auVar24._0_10_;
  auVar19._10_2_ = alVar6[0]._4_2_;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = auVar24._0_8_;
  auVar18._8_2_ = auVar24._4_2_;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._6_2_ = alVar6[0]._2_2_;
  auVar17._4_2_ = auVar24._2_2_;
  auVar17._0_2_ = auVar24._0_2_;
  auVar17._2_2_ = (short)alVar6[0];
  auVar29._2_2_ = (short)alVar6[1];
  auVar29._0_2_ = auVar24._8_2_;
  auVar29._4_2_ = auVar24._10_2_;
  auVar29._6_2_ = alVar6[1]._2_2_;
  auVar29._8_2_ = auVar24._12_2_;
  auVar29._10_2_ = alVar6[1]._4_2_;
  auVar29._12_2_ = auVar24._14_2_;
  auVar29._14_2_ = alVar6[1]._6_2_;
  auVar12 = pmaddwd(auVar17,auVar33);
  auVar5 = pmaddwd(auVar33,auVar29);
  auVar22 = pmaddwd(auVar17,auVar44);
  auVar45 = pmaddwd(auVar44,auVar29);
  auVar37._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar34._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  alVar38 = (__m128i)packssdw(auVar37,auVar34);
  auVar24._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar46._0_4_ = auVar45._0_4_ + 0x800 >> 0xc;
  auVar46._4_4_ = auVar45._4_4_ + 0x800 >> 0xc;
  auVar46._8_4_ = auVar45._8_4_ + 0x800 >> 0xc;
  auVar46._12_4_ = auVar45._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar24,auVar46);
  auVar47._8_4_ = 0xb500b50;
  auVar47._0_8_ = 0xb500b500b500b50;
  auVar47._12_4_ = 0xb500b50;
  auVar24 = pmaddwd(auVar64,auVar47);
  auVar12 = pmaddwd(auVar49,auVar47);
  auVar56._8_4_ = 0xf4b00b50;
  auVar56._0_8_ = 0xf4b00b50f4b00b50;
  auVar56._12_4_ = 0xf4b00b50;
  auVar22 = pmaddwd(auVar64,auVar56);
  auVar50 = pmaddwd(auVar49,auVar56);
  auVar35._0_4_ = auVar24._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar24._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar24._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar24._12_4_ + 0x800 >> 0xc;
  auVar25._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar25._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar25._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar25._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar45 = packssdw(auVar35,auVar25);
  auVar9._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar51._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  alVar10 = (__m128i)packssdw(auVar9,auVar51);
  alVar36 = (__m128i)psubsw((undefined1  [16])0x0,auVar58);
  auVar62._0_12_ = auVar58._0_12_;
  auVar62._12_2_ = auVar58._6_2_;
  auVar62._14_2_ = alVar15[0]._6_2_;
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._0_10_ = auVar58._0_10_;
  auVar61._10_2_ = alVar15[0]._4_2_;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._0_8_ = auVar58._0_8_;
  auVar60._8_2_ = auVar58._4_2_;
  auVar59._8_8_ = auVar60._8_8_;
  auVar59._6_2_ = alVar15[0]._2_2_;
  auVar59._4_2_ = auVar58._2_2_;
  auVar59._0_2_ = auVar58._0_2_;
  auVar59._2_2_ = (short)alVar15[0];
  auVar52._2_2_ = (short)alVar15[1];
  auVar52._0_2_ = auVar58._8_2_;
  auVar52._4_2_ = auVar58._10_2_;
  auVar52._6_2_ = alVar15[1]._2_2_;
  auVar52._8_2_ = auVar58._12_2_;
  auVar52._10_2_ = alVar15[1]._4_2_;
  auVar52._12_2_ = auVar58._14_2_;
  auVar52._14_2_ = alVar15[1]._6_2_;
  auVar22 = pmaddwd(auVar59,auVar47);
  auVar24 = pmaddwd(auVar52,auVar47);
  auVar12._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar26._0_4_ = auVar24._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar24._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar24._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar24._12_4_ + 0x800 >> 0xc;
  alVar4 = (__m128i)packssdw(auVar12,auVar26);
  auVar12 = pmaddwd(auVar59,auVar56);
  auVar22 = pmaddwd(auVar52,auVar56);
  auVar63._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar53._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar64 = packssdw(auVar63,auVar53);
  auVar22 = pmaddwd(auVar17,auVar47);
  auVar12 = pmaddwd(auVar29,auVar47);
  auVar27._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar54._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  alVar28 = (__m128i)packssdw(auVar27,auVar54);
  auVar22 = pmaddwd(auVar17,auVar56);
  auVar12 = pmaddwd(auVar29,auVar56);
  auVar21._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar30._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar21,auVar30);
  local_38 = auVar2._0_8_;
  lStack_30 = auVar2._8_8_;
  output[1][0] = local_38;
  output[1][1] = lStack_30;
  output[2] = alVar38;
  auVar42._0_12_ = alVar38._0_12_;
  auVar42._12_2_ = alVar38[0]._6_2_;
  auVar42._14_2_ = auVar5._6_2_;
  auVar41._12_4_ = auVar42._12_4_;
  auVar41._0_10_ = alVar38._0_10_;
  auVar41._10_2_ = auVar5._4_2_;
  auVar40._10_6_ = auVar41._10_6_;
  auVar40._0_8_ = alVar38[0];
  auVar40._8_2_ = alVar38[0]._4_2_;
  auVar39._8_8_ = auVar40._8_8_;
  auVar39._6_2_ = auVar5._2_2_;
  auVar39._4_2_ = alVar38[0]._2_2_;
  auVar39._0_2_ = (undefined2)alVar38[0];
  auVar39._2_2_ = auVar5._0_2_;
  auVar31._2_2_ = auVar5._8_2_;
  auVar31._0_2_ = (short)alVar38[1];
  auVar31._4_2_ = alVar38[1]._2_2_;
  auVar31._6_2_ = auVar5._10_2_;
  auVar31._8_2_ = alVar38[1]._4_2_;
  auVar31._10_2_ = auVar5._12_2_;
  auVar31._12_2_ = alVar38[1]._6_2_;
  auVar31._14_2_ = auVar5._14_2_;
  auVar50 = pmaddwd(auVar39,auVar47);
  auVar24 = pmaddwd(auVar47,auVar31);
  auVar12 = pmaddwd(auVar39,auVar56);
  auVar2 = pmaddwd(auVar31,auVar56);
  auVar55._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  auVar48._0_4_ = auVar24._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar24._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar24._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar24._12_4_ + 0x800 >> 0xc;
  auVar24 = packssdw(auVar55,auVar48);
  auVar43._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar32._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  alVar38 = (__m128i)packssdw(auVar43,auVar32);
  output[3] = alVar36;
  output[4] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar24);
  output[5] = alVar4;
  output[6] = alVar28;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar45);
  output[7] = alVar4;
  output[8] = alVar10;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar22);
  output[9] = alVar4;
  output[10] = alVar38;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar64);
  output[0xb] = alVar4;
  output[0xc] = alVar15;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar5);
  output[0xd] = alVar4;
  output[0xe] = alVar6;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar3);
  output[0xf] = alVar4;
  return;
}

Assistant:

static void iadst16_low1_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[1] = input[0];

  // stage 2
  btf_16_ssse3(cospi[62], -cospi[2], x[1], x[0], x[1]);

  // stage 3
  x[8] = x[0];
  x[9] = x[1];

  // stage 4
  btf_16_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);

  // stage 5
  x[4] = x[0];
  x[5] = x[1];
  x[12] = x[8];
  x[13] = x[9];

  // stage 6
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);

  // stage 7
  x[2] = x[0];
  x[3] = x[1];
  x[6] = x[4];
  x[7] = x[5];
  x[10] = x[8];
  x[11] = x[9];
  x[14] = x[12];
  x[15] = x[13];

  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}